

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorTable.cpp
# Opt level: O0

Vector * __thiscall
ColorTable::find_color(Vector *__return_storage_ptr__,ColorTable *this,double value)

{
  Vector local_60;
  Vector local_48;
  double local_30;
  double t;
  double dStack_20;
  int i;
  double value_local;
  ColorTable *this_local;
  
  dStack_20 = value;
  value_local = (double)this;
  this_local = (ColorTable *)__return_storage_ptr__;
  if (this->color_entries < 1) {
    Vector::Vector(__return_storage_ptr__,0.0);
  }
  else if (this->entries->ta < value) {
    for (t._4_4_ = 0; t._4_4_ < this->color_entries; t._4_4_ = t._4_4_ + 1) {
      if (value <= this->entries[t._4_4_].tb) {
        local_30 = (value - this->entries[t._4_4_].ta) /
                   (this->entries[t._4_4_].tb - this->entries[t._4_4_].ta);
        operator*(&local_48,&this->entries[t._4_4_].ca,1.0 - local_30);
        operator*(&local_60,&this->entries[t._4_4_].cb,local_30);
        operator+(__return_storage_ptr__,&local_48,&local_60);
        return __return_storage_ptr__;
      }
    }
    Vector::Vector(__return_storage_ptr__,&this->entries[this->color_entries + -1].cb);
  }
  else {
    Vector::Vector(__return_storage_ptr__,&this->entries->ca);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector ColorTable::find_color(double value)
{
   if (color_entries < 1) return Vector(0);

   if (value <= entries[0].ta) return entries[0].ca;

   for (int i = 0; i < color_entries; ++i)
      if (value <= entries[i].tb)
      {
         double t = (value - entries[i].ta)/(entries[i].tb-entries[i].ta);
         return entries[i].ca*(1-t)+entries[i].cb*t;
         //Entries[i].ca+t*(Entries[i].cb-Entries[i].ca);
      }
   return entries[color_entries - 1].cb;
}